

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001e4fc0 = 0x2e2e2e2e2e2e2e;
    uRam00000000001e4fc7._0_1_ = '.';
    uRam00000000001e4fc7._1_1_ = '.';
    uRam00000000001e4fc7._2_1_ = '.';
    uRam00000000001e4fc7._3_1_ = '.';
    uRam00000000001e4fc7._4_1_ = '.';
    uRam00000000001e4fc7._5_1_ = '.';
    uRam00000000001e4fc7._6_1_ = '.';
    uRam00000000001e4fc7._7_1_ = '.';
    DAT_001e4fb0 = '.';
    DAT_001e4fb0_1._0_1_ = '.';
    DAT_001e4fb0_1._1_1_ = '.';
    DAT_001e4fb0_1._2_1_ = '.';
    DAT_001e4fb0_1._3_1_ = '.';
    DAT_001e4fb0_1._4_1_ = '.';
    DAT_001e4fb0_1._5_1_ = '.';
    DAT_001e4fb0_1._6_1_ = '.';
    uRam00000000001e4fb8 = 0x2e2e2e2e2e2e2e;
    DAT_001e4fbf = 0x2e;
    DAT_001e4fa0 = '.';
    DAT_001e4fa0_1._0_1_ = '.';
    DAT_001e4fa0_1._1_1_ = '.';
    DAT_001e4fa0_1._2_1_ = '.';
    DAT_001e4fa0_1._3_1_ = '.';
    DAT_001e4fa0_1._4_1_ = '.';
    DAT_001e4fa0_1._5_1_ = '.';
    DAT_001e4fa0_1._6_1_ = '.';
    uRam00000000001e4fa8._0_1_ = '.';
    uRam00000000001e4fa8._1_1_ = '.';
    uRam00000000001e4fa8._2_1_ = '.';
    uRam00000000001e4fa8._3_1_ = '.';
    uRam00000000001e4fa8._4_1_ = '.';
    uRam00000000001e4fa8._5_1_ = '.';
    uRam00000000001e4fa8._6_1_ = '.';
    uRam00000000001e4fa8._7_1_ = '.';
    DAT_001e4f90 = '.';
    DAT_001e4f90_1._0_1_ = '.';
    DAT_001e4f90_1._1_1_ = '.';
    DAT_001e4f90_1._2_1_ = '.';
    DAT_001e4f90_1._3_1_ = '.';
    DAT_001e4f90_1._4_1_ = '.';
    DAT_001e4f90_1._5_1_ = '.';
    DAT_001e4f90_1._6_1_ = '.';
    uRam00000000001e4f98._0_1_ = '.';
    uRam00000000001e4f98._1_1_ = '.';
    uRam00000000001e4f98._2_1_ = '.';
    uRam00000000001e4f98._3_1_ = '.';
    uRam00000000001e4f98._4_1_ = '.';
    uRam00000000001e4f98._5_1_ = '.';
    uRam00000000001e4f98._6_1_ = '.';
    uRam00000000001e4f98._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001e4f88._0_1_ = '.';
    uRam00000000001e4f88._1_1_ = '.';
    uRam00000000001e4f88._2_1_ = '.';
    uRam00000000001e4f88._3_1_ = '.';
    uRam00000000001e4f88._4_1_ = '.';
    uRam00000000001e4f88._5_1_ = '.';
    uRam00000000001e4f88._6_1_ = '.';
    uRam00000000001e4f88._7_1_ = '.';
    DAT_001e4fcf = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}